

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sorter.cpp
# Opt level: O1

void __thiscall
duckdb::MergeSorter::MergeData
          (MergeSorter *this,SortedData *result_data,SortedData *l_data,SortedData *r_data,
          idx_t *count,bool *left_smaller,idx_t *next_entry_sizes,bool reset_indices)

{
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *this_00;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *this_01;
  idx_t iVar1;
  _Head_base<0UL,_duckdb::RowDataBlock_*,_false> _Var2;
  idx_t iVar3;
  pointer puVar4;
  pointer puVar5;
  idx_t iVar6;
  idx_t iVar7;
  idx_t iVar8;
  idx_t iVar9;
  idx_t iVar10;
  data_ptr_t *source_data_ptr;
  data_ptr_t pdVar11;
  data_ptr_t pdVar12;
  RowDataBlock *pRVar13;
  type pSVar14;
  bool *pbVar15;
  type this_02;
  reference pvVar16;
  RowLayout *layout;
  MergeSorter *this_03;
  pointer pRVar17;
  int *piVar18;
  pointer pSVar19;
  int *piVar20;
  idx_t *piVar21;
  idx_t new_capacity;
  MergeSorter *pMVar22;
  ulong uVar23;
  ulong uVar24;
  idx_t iVar25;
  long lVar26;
  idx_t *piVar27;
  int **source_heap_ptr;
  int iVar28;
  ulong uVar29;
  idx_t iVar30;
  long lVar31;
  size_t sVar32;
  idx_t iVar33;
  bool bVar34;
  MergeSorter *local_1d0;
  MergeSorter *local_1c8;
  SortedData *local_1c0;
  idx_t *local_1b8;
  SortedData *local_1b0;
  ulong *local_1a8;
  idx_t *local_1a0;
  data_ptr_t r_ptr;
  data_ptr_t l_ptr;
  RowDataBlock *local_188;
  SortedData *local_180;
  RowDataBlock *local_178;
  type local_170;
  MergeSorter *local_168;
  int *local_160;
  int *local_158;
  idx_t row_width;
  idx_t local_148;
  bool *local_140;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *local_138;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *local_130;
  idx_t local_128;
  idx_t local_120;
  idx_t copied;
  GlobalSortState **local_100;
  GlobalSortState **local_f8;
  long local_f0;
  idx_t copied_copy;
  BufferHandle result_heap_handle;
  data_ptr_t result_data_ptr_copy;
  idx_t r_idx_copy;
  idx_t l_idx_copy;
  BufferHandle result_data_handle;
  
  local_1c0 = r_data;
  local_1a8 = count;
  this_02 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator*(&this->left);
  local_170 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
              operator*(&this->right);
  iVar7 = this_02->block_idx;
  iVar8 = this_02->entry_idx;
  iVar9 = local_170->block_idx;
  iVar10 = local_170->entry_idx;
  iVar1 = (result_data->layout).row_width;
  local_148 = (result_data->layout).heap_pointer_offset;
  local_1b0 = result_data;
  row_width = iVar1;
  pvVar16 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
            ::back(&result_data->data_blocks);
  _Var2._M_head_impl =
       (pvVar16->super_unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>)
       ._M_t.super___uniq_ptr_impl<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>.
       super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl;
  local_1c8 = this;
  (*this->buffer_manager->_vptr_BufferManager[7])
            (&result_data_handle,this->buffer_manager,_Var2._M_head_impl);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&result_data_handle.node);
  local_1d0 = (MergeSorter *)
              ((result_data_handle.node.ptr)->buffer + iVar1 * (_Var2._M_head_impl)->count);
  this_03 = (MergeSorter *)&result_heap_handle;
  BufferHandle::BufferHandle((BufferHandle *)this_03);
  local_178 = _Var2._M_head_impl;
  local_140 = left_smaller;
  if (((local_1b0->layout).all_constant == false) && (local_1c8->state->external == true)) {
    pvVar16 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
              ::back(&local_1b0->heap_blocks);
    _Var2._M_head_impl =
         (pvVar16->
         super_unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>)._M_t.
         super___uniq_ptr_impl<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>.
         super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl;
    (*local_1c8->buffer_manager->_vptr_BufferManager[7])
              (&copied,local_1c8->buffer_manager,_Var2._M_head_impl);
    BufferHandle::operator=(&result_heap_handle,(BufferHandle *)&copied);
    BufferHandle::~BufferHandle((BufferHandle *)&copied);
    this_03 = (MergeSorter *)&result_heap_handle.node;
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid
              ((optional_ptr<duckdb::FileBuffer,_true> *)this_03);
    local_168 = (MergeSorter *)
                ((result_heap_handle.node.ptr)->buffer + (_Var2._M_head_impl)->byte_offset);
    local_188 = _Var2._M_head_impl;
  }
  else {
    local_188 = (RowDataBlock *)0x0;
  }
  copied = 0;
  if (*local_1a8 != 0) {
    local_1a0 = &this_02->entry_idx;
    local_1b8 = &local_170->entry_idx;
    layout = &local_1b0->layout;
    local_f8 = &this_02->state;
    local_100 = &local_170->state;
    local_130 = &l_data->data_blocks;
    this_00 = &l_data->heap_blocks;
    local_138 = &local_1c0->data_blocks;
    this_01 = &local_1c0->heap_blocks;
    local_180 = l_data;
    do {
      iVar1 = copied;
      pSVar14 = local_170;
      piVar21 = local_1b8;
      if (this_02->block_idx <
          (ulong)((long)(l_data->data_blocks).
                        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(l_data->data_blocks).
                        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        iVar3 = *local_1a0;
        this_03 = (MergeSorter *)
                  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                  ::operator[](local_130,this_02->block_idx);
        pRVar17 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  ::operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                                *)this_03);
        if (iVar3 == pRVar17->count) {
          pvVar16 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                    ::operator[](local_130,this_02->block_idx);
          pRVar17 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                    ::operator->(pvVar16);
          this_03 = (MergeSorter *)
                    (pRVar17->block).internal.
                    super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          (pRVar17->block).internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (pRVar17->block).internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (this_03 != (MergeSorter *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03);
          }
          if (((local_1b0->layout).all_constant == false) && (local_1c8->state->external == true)) {
            pvVar16 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                      ::operator[](this_00,this_02->block_idx);
            pRVar17 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                      ::operator->(pvVar16);
            this_03 = (MergeSorter *)
                      (pRVar17->block).internal.
                      super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            (pRVar17->block).internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (pRVar17->block).internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (this_03 != (MergeSorter *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03);
            }
          }
          this_02->block_idx = this_02->block_idx + 1;
          this_02->entry_idx = 0;
        }
      }
      if (pSVar14->block_idx <
          (ulong)((long)(local_1c0->data_blocks).
                        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_1c0->data_blocks).
                        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        iVar3 = *piVar21;
        this_03 = (MergeSorter *)
                  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                  ::operator[](local_138,pSVar14->block_idx);
        pRVar17 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  ::operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                                *)this_03);
        if (iVar3 == pRVar17->count) {
          pvVar16 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                    ::operator[](local_138,pSVar14->block_idx);
          pRVar17 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                    ::operator->(pvVar16);
          this_03 = (MergeSorter *)
                    (pRVar17->block).internal.
                    super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          (pRVar17->block).internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (pRVar17->block).internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (this_03 != (MergeSorter *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03);
          }
          if (((local_1b0->layout).all_constant == false) && (local_1c8->state->external == true)) {
            pvVar16 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                      ::operator[](this_01,pSVar14->block_idx);
            pRVar17 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                      ::operator->(pvVar16);
            this_03 = (MergeSorter *)
                      (pRVar17->block).internal.
                      super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            (pRVar17->block).internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (pRVar17->block).internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (this_03 != (MergeSorter *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03);
            }
          }
          pSVar14->block_idx = pSVar14->block_idx + 1;
          pSVar14->entry_idx = 0;
        }
      }
      iVar3 = this_02->block_idx;
      iVar25 = (long)(l_data->data_blocks).
                     super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(l_data->data_blocks).
                     super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      puVar4 = (local_1c0->data_blocks).
               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar5 = (local_1c0->data_blocks).
               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar6 = pSVar14->block_idx;
      if (iVar3 != iVar25) {
        SBScanState::PinData(this_02,l_data);
        pMVar22 = (MergeSorter *)(local_f8 + 0xf);
        if (l_data->type == BLOB) {
          pMVar22 = (MergeSorter *)(local_f8 + 9);
        }
        this_03 = pMVar22;
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid
                  ((optional_ptr<duckdb::FileBuffer,_true> *)pMVar22);
        l_ptr = (data_ptr_t)
                ((long)&((((shared_ptr<duckdb::BlockHandle,_true> *)&pMVar22->state)->internal).
                         super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->block_manager->_vptr_BlockManager +
                (l_data->layout).row_width * *local_1a0);
      }
      iVar33 = (long)puVar4 - (long)puVar5 >> 3;
      if (iVar6 != iVar33) {
        SBScanState::PinData(local_170,local_1c0);
        pMVar22 = (MergeSorter *)(local_100 + 0xf);
        if (local_1c0->type == BLOB) {
          pMVar22 = (MergeSorter *)(local_100 + 9);
        }
        this_03 = pMVar22;
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid
                  ((optional_ptr<duckdb::FileBuffer,_true> *)pMVar22);
        r_ptr = (data_ptr_t)
                ((long)&((((shared_ptr<duckdb::BlockHandle,_true> *)&pMVar22->state)->internal).
                         super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->block_manager->_vptr_BlockManager +
                (local_1c0->layout).row_width * *local_1b8);
      }
      if (iVar3 == iVar25) {
        iVar30 = 0;
      }
      else {
        this_03 = (MergeSorter *)
                  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                  ::operator[](local_130,this_02->block_idx);
        pRVar17 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  ::operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                                *)this_03);
        iVar30 = pRVar17->count;
      }
      local_120 = iVar30;
      if (iVar6 == iVar33) {
        local_128 = 0;
      }
      else {
        this_03 = (MergeSorter *)
                  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                  ::operator[](local_138,local_170->block_idx);
        pRVar17 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  ::operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                                *)this_03);
        local_128 = pRVar17->count;
      }
      pRVar13 = local_178;
      l_data = local_180;
      pdVar12 = l_ptr;
      pdVar11 = r_ptr;
      piVar27 = local_1a0;
      piVar21 = local_1b8;
      pMVar22 = local_1d0;
      if (((local_1b0->layout).all_constant == false) && (local_1c8->state->external != false)) {
        if (iVar3 != iVar25) {
          pMVar22 = (MergeSorter *)(local_f8 + 0x12);
          if (local_180->type == BLOB) {
            pMVar22 = (MergeSorter *)(local_f8 + 0xc);
          }
          this_03 = pMVar22;
          optional_ptr<duckdb::FileBuffer,_true>::CheckValid
                    ((optional_ptr<duckdb::FileBuffer,_true> *)pMVar22);
          local_158 = (int *)(*(data_ptr_t *)
                               ((long)&(pMVar22->state->lock).super___mutex_base._M_mutex + 8) +
                             *(long *)(l_ptr + local_148));
        }
        if (iVar6 != iVar33) {
          pMVar22 = (MergeSorter *)(local_100 + 0x12);
          if (local_1c0->type == BLOB) {
            pMVar22 = (MergeSorter *)(local_100 + 0xc);
          }
          this_03 = pMVar22;
          optional_ptr<duckdb::FileBuffer,_true>::CheckValid
                    ((optional_ptr<duckdb::FileBuffer,_true> *)pMVar22);
          local_160 = (int *)(*(data_ptr_t *)
                               ((long)&(pMVar22->state->lock).super___mutex_base._M_mutex + 8) +
                             *(long *)(r_ptr + local_148));
        }
        pbVar15 = local_140;
        if ((iVar3 == iVar25) || (iVar6 == iVar33)) {
          bVar34 = iVar6 == iVar33;
          piVar21 = &local_128;
          if (bVar34) {
            piVar21 = &local_120;
          }
          piVar27 = local_1b8;
          source_data_ptr = &r_ptr;
          if (bVar34) {
            piVar27 = local_1a0;
            source_data_ptr = &l_ptr;
          }
          source_heap_ptr = &local_160;
          if (bVar34) {
            source_heap_ptr = &local_158;
          }
          this_03 = local_1c8;
          FlushBlobs(local_1c8,layout,piVar21,source_data_ptr,piVar27,(data_ptr_t *)source_heap_ptr,
                     local_178,(data_ptr_t *)&local_1d0,local_188,&result_heap_handle,
                     (data_ptr_t *)&local_168,&copied,local_1a8);
        }
        else {
          l_idx_copy = *local_1a0;
          r_idx_copy = *local_1b8;
          result_data_ptr_copy = (data_ptr_t)local_1d0;
          copied_copy = iVar1;
          MergeRows(this_03,&l_ptr,&l_idx_copy,&local_120,&r_ptr,&r_idx_copy,&local_128,local_178,
                    &result_data_ptr_copy,&row_width,local_140,&copied_copy,local_1a8);
          iVar3 = copied_copy;
          pRVar13 = local_188;
          local_f0 = copied_copy - iVar1;
          if (local_f0 == 0) {
            lVar31 = 0;
          }
          else {
            lVar31 = 0;
            piVar18 = local_160;
            piVar20 = local_158;
            this_03 = (MergeSorter *)iVar1;
            do {
              *(idx_t *)((long)&(((shared_ptr<duckdb::BlockHandle,_true> *)&local_1d0->state)->
                                internal).
                                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr + local_148) = local_188->byte_offset + lVar31;
              uVar23 = (ulong)pbVar15[(long)this_03];
              iVar28 = 0;
              if (uVar23 == 0) {
                iVar28 = *piVar18;
              }
              uVar29 = (ulong)(*piVar20 * (uint)pbVar15[(long)this_03] + iVar28);
              uVar24 = 0;
              if (uVar23 == 0) {
                uVar24 = uVar29;
              }
              local_1d0 = (MergeSorter *)
                          ((long)&(((shared_ptr<duckdb::BlockHandle,_true> *)&local_1d0->state)->
                                  internal).
                                  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + row_width);
              next_entry_sizes[(long)this_03] = uVar29;
              piVar20 = (int *)((long)piVar20 + uVar23 * uVar29);
              piVar18 = (int *)((long)piVar18 + uVar24);
              lVar31 = lVar31 + uVar29;
              this_03 = (MergeSorter *)
                        ((long)&(((shared_ptr<duckdb::BlockHandle,_true> *)&this_03->state)->
                                internal).
                                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr + 1);
            } while ((MergeSorter *)copied_copy != this_03);
          }
          uVar23 = local_188->byte_offset + lVar31;
          if (local_188->capacity < uVar23) {
            (*local_1c8->buffer_manager->_vptr_BufferManager[6])
                      (local_1c8->buffer_manager,local_188,uVar23);
            pRVar13->capacity = uVar23;
            this_03 = (MergeSorter *)&result_heap_handle.node;
            optional_ptr<duckdb::FileBuffer,_true>::CheckValid
                      ((optional_ptr<duckdb::FileBuffer,_true> *)this_03);
            local_168 = (MergeSorter *)
                        ((result_heap_handle.node.ptr)->buffer + pRVar13->byte_offset);
          }
          iVar6 = copied;
          pbVar15 = local_140;
          piVar18 = local_160;
          piVar20 = local_158;
          pMVar22 = local_168;
          if (iVar3 != iVar1) {
            lVar26 = 0;
            do {
              uVar23 = (ulong)pbVar15[lVar26 + iVar6];
              uVar24 = uVar23 ^ 1;
              this_03 = pMVar22;
              switchD_012dd528::default
                        (pMVar22,(void *)((long)piVar18 * uVar24 + (long)piVar20 * uVar23),
                         next_entry_sizes[iVar6 + lVar26]);
              iVar1 = next_entry_sizes[iVar6 + lVar26];
              pMVar22 = (MergeSorter *)
                        ((long)&(((shared_ptr<duckdb::BlockHandle,_true> *)&pMVar22->state)->
                                internal).
                                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr + iVar1);
              uVar23 = (ulong)pbVar15[lVar26 + iVar6];
              piVar20 = (int *)(iVar1 * uVar23 + (long)piVar20);
              *local_1a0 = *local_1a0 + uVar23;
              piVar18 = (int *)(iVar1 * uVar24 + (long)piVar18);
              *local_1b8 = *local_1b8 + uVar24;
              lVar26 = lVar26 + 1;
            } while (local_f0 != lVar26);
          }
          local_188->count = local_188->count + local_f0;
          local_188->byte_offset = local_188->byte_offset + lVar31;
          copied = copied + local_f0;
          l_data = local_180;
          local_168 = pMVar22;
          local_160 = piVar18;
          local_158 = piVar20;
        }
      }
      else if ((iVar3 == iVar25) || (iVar6 == iVar33)) {
        uVar23 = *local_1a8 - iVar1;
        if (iVar6 == iVar33) {
          uVar24 = local_178->capacity - local_178->count;
          if (uVar23 < uVar24) {
            uVar24 = uVar23;
          }
          uVar23 = iVar30 - *local_1a0;
          if (uVar24 < iVar30 - *local_1a0) {
            uVar23 = uVar24;
          }
          sVar32 = row_width * uVar23;
          switchD_012dd528::default(local_1d0,l_ptr,sVar32);
          l_ptr = pdVar12 + sVar32;
          *piVar27 = *piVar27 + uVar23;
          piVar21 = &pRVar13->count;
          *piVar21 = *piVar21 + uVar23;
          copied = uVar23 + iVar1;
          this_03 = local_1d0;
          l_data = local_180;
          local_1d0 = (MergeSorter *)
                      ((long)&(((shared_ptr<duckdb::BlockHandle,_true> *)&pMVar22->state)->internal)
                              .super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + sVar32);
        }
        else {
          uVar24 = local_178->capacity - local_178->count;
          if (uVar23 < uVar24) {
            uVar24 = uVar23;
          }
          uVar23 = local_128 - *local_1b8;
          if (uVar24 < local_128 - *local_1b8) {
            uVar23 = uVar24;
          }
          sVar32 = row_width * uVar23;
          switchD_012dd528::default(local_1d0,r_ptr,sVar32);
          r_ptr = pdVar11 + sVar32;
          *piVar21 = *piVar21 + uVar23;
          piVar21 = &pRVar13->count;
          *piVar21 = *piVar21 + uVar23;
          copied = uVar23 + iVar1;
          this_03 = local_1d0;
          l_data = local_180;
          local_1d0 = (MergeSorter *)
                      ((long)&(((shared_ptr<duckdb::BlockHandle,_true> *)&pMVar22->state)->internal)
                              .super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + sVar32);
        }
      }
      else {
        MergeRows(this_03,&l_ptr,local_1a0,&local_120,&r_ptr,local_1b8,&local_128,local_178,
                  (data_ptr_t *)&local_1d0,&row_width,local_140,&copied,local_1a8);
        l_data = local_180;
      }
    } while (copied < *local_1a8);
  }
  if (reset_indices) {
    pSVar19 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
              operator->(&this->left);
    pSVar19->block_idx = iVar7;
    pSVar19->entry_idx = iVar8;
    pSVar19 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
              operator->(&this->right);
    pSVar19->block_idx = iVar9;
    pSVar19->entry_idx = iVar10;
  }
  BufferHandle::~BufferHandle(&result_heap_handle);
  BufferHandle::~BufferHandle(&result_data_handle);
  return;
}

Assistant:

void MergeSorter::MergeData(SortedData &result_data, SortedData &l_data, SortedData &r_data, const idx_t &count,
                            const bool left_smaller[], idx_t next_entry_sizes[], bool reset_indices) {
	auto &l = *left;
	auto &r = *right;
	// Save indices to restore afterwards
	idx_t l_block_idx_before = l.block_idx;
	idx_t l_entry_idx_before = l.entry_idx;
	idx_t r_block_idx_before = r.block_idx;
	idx_t r_entry_idx_before = r.entry_idx;

	const auto &layout = result_data.layout;
	const idx_t row_width = layout.GetRowWidth();
	const idx_t heap_pointer_offset = layout.GetHeapOffset();

	// Left and right row data to merge
	data_ptr_t l_ptr;
	data_ptr_t r_ptr;
	// Accompanying left and right heap data (if needed)
	data_ptr_t l_heap_ptr;
	data_ptr_t r_heap_ptr;

	// Result rows to write to
	RowDataBlock *result_data_block = result_data.data_blocks.back().get();
	auto result_data_handle = buffer_manager.Pin(result_data_block->block);
	data_ptr_t result_data_ptr = result_data_handle.Ptr() + result_data_block->count * row_width;
	// Result heap to write to (if needed)
	RowDataBlock *result_heap_block = nullptr;
	BufferHandle result_heap_handle;
	data_ptr_t result_heap_ptr;
	if (!layout.AllConstant() && state.external) {
		result_heap_block = result_data.heap_blocks.back().get();
		result_heap_handle = buffer_manager.Pin(result_heap_block->block);
		result_heap_ptr = result_heap_handle.Ptr() + result_heap_block->byte_offset;
	}

	idx_t copied = 0;
	while (copied < count) {
		// Move to new data blocks (if needed)
		if (l.block_idx < l_data.data_blocks.size() && l.entry_idx == l_data.data_blocks[l.block_idx]->count) {
			// Delete reference to previous block
			l_data.data_blocks[l.block_idx]->block = nullptr;
			if (!layout.AllConstant() && state.external) {
				l_data.heap_blocks[l.block_idx]->block = nullptr;
			}
			// Advance block
			l.block_idx++;
			l.entry_idx = 0;
		}
		if (r.block_idx < r_data.data_blocks.size() && r.entry_idx == r_data.data_blocks[r.block_idx]->count) {
			// Delete reference to previous block
			r_data.data_blocks[r.block_idx]->block = nullptr;
			if (!layout.AllConstant() && state.external) {
				r_data.heap_blocks[r.block_idx]->block = nullptr;
			}
			// Advance block
			r.block_idx++;
			r.entry_idx = 0;
		}
		const bool l_done = l.block_idx == l_data.data_blocks.size();
		const bool r_done = r.block_idx == r_data.data_blocks.size();
		// Pin the row data blocks
		if (!l_done) {
			l.PinData(l_data);
			l_ptr = l.DataPtr(l_data);
		}
		if (!r_done) {
			r.PinData(r_data);
			r_ptr = r.DataPtr(r_data);
		}
		const idx_t &l_count = !l_done ? l_data.data_blocks[l.block_idx]->count : 0;
		const idx_t &r_count = !r_done ? r_data.data_blocks[r.block_idx]->count : 0;
		// Perform the merge
		if (layout.AllConstant() || !state.external) {
			// If all constant size, or if we are doing an in-memory sort, we do not need to touch the heap
			if (!l_done && !r_done) {
				// Both sides have data - merge
				MergeRows(l_ptr, l.entry_idx, l_count, r_ptr, r.entry_idx, r_count, *result_data_block, result_data_ptr,
				          row_width, left_smaller, copied, count);
			} else if (r_done) {
				// Right side is exhausted
				FlushRows(l_ptr, l.entry_idx, l_count, *result_data_block, result_data_ptr, row_width, copied, count);
			} else {
				// Left side is exhausted
				FlushRows(r_ptr, r.entry_idx, r_count, *result_data_block, result_data_ptr, row_width, copied, count);
			}
		} else {
			// External sorting with variable size data. Pin the heap blocks too
			if (!l_done) {
				l_heap_ptr = l.BaseHeapPtr(l_data) + Load<idx_t>(l_ptr + heap_pointer_offset);
				D_ASSERT(l_heap_ptr - l.BaseHeapPtr(l_data) >= 0);
				D_ASSERT((idx_t)(l_heap_ptr - l.BaseHeapPtr(l_data)) < l_data.heap_blocks[l.block_idx]->byte_offset);
			}
			if (!r_done) {
				r_heap_ptr = r.BaseHeapPtr(r_data) + Load<idx_t>(r_ptr + heap_pointer_offset);
				D_ASSERT(r_heap_ptr - r.BaseHeapPtr(r_data) >= 0);
				D_ASSERT((idx_t)(r_heap_ptr - r.BaseHeapPtr(r_data)) < r_data.heap_blocks[r.block_idx]->byte_offset);
			}
			// Both the row and heap data need to be dealt with
			if (!l_done && !r_done) {
				// Both sides have data - merge
				idx_t l_idx_copy = l.entry_idx;
				idx_t r_idx_copy = r.entry_idx;
				data_ptr_t result_data_ptr_copy = result_data_ptr;
				idx_t copied_copy = copied;
				// Merge row data
				MergeRows(l_ptr, l_idx_copy, l_count, r_ptr, r_idx_copy, r_count, *result_data_block,
				          result_data_ptr_copy, row_width, left_smaller, copied_copy, count);
				const idx_t merged = copied_copy - copied;
				// Compute the entry sizes and number of heap bytes that will be copied
				idx_t copy_bytes = 0;
				data_ptr_t l_heap_ptr_copy = l_heap_ptr;
				data_ptr_t r_heap_ptr_copy = r_heap_ptr;
				for (idx_t i = 0; i < merged; i++) {
					// Store base heap offset in the row data
					Store<idx_t>(result_heap_block->byte_offset + copy_bytes, result_data_ptr + heap_pointer_offset);
					result_data_ptr += row_width;
					// Compute entry size and add to total
					const bool &l_smaller = left_smaller[copied + i];
					const bool r_smaller = !l_smaller;
					auto &entry_size = next_entry_sizes[copied + i];
					entry_size =
					    l_smaller * Load<uint32_t>(l_heap_ptr_copy) + r_smaller * Load<uint32_t>(r_heap_ptr_copy);
					D_ASSERT(entry_size >= sizeof(uint32_t));
					D_ASSERT(NumericCast<idx_t>(l_heap_ptr_copy - l.BaseHeapPtr(l_data)) + l_smaller * entry_size <=
					         l_data.heap_blocks[l.block_idx]->byte_offset);
					D_ASSERT(NumericCast<idx_t>(r_heap_ptr_copy - r.BaseHeapPtr(r_data)) + r_smaller * entry_size <=
					         r_data.heap_blocks[r.block_idx]->byte_offset);
					l_heap_ptr_copy += l_smaller * entry_size;
					r_heap_ptr_copy += r_smaller * entry_size;
					copy_bytes += entry_size;
				}
				// Reallocate result heap block size (if needed)
				if (result_heap_block->byte_offset + copy_bytes > result_heap_block->capacity) {
					idx_t new_capacity = result_heap_block->byte_offset + copy_bytes;
					buffer_manager.ReAllocate(result_heap_block->block, new_capacity);
					result_heap_block->capacity = new_capacity;
					result_heap_ptr = result_heap_handle.Ptr() + result_heap_block->byte_offset;
				}
				D_ASSERT(result_heap_block->byte_offset + copy_bytes <= result_heap_block->capacity);
				// Now copy the heap data
				for (idx_t i = 0; i < merged; i++) {
					const bool &l_smaller = left_smaller[copied + i];
					const bool r_smaller = !l_smaller;
					const auto &entry_size = next_entry_sizes[copied + i];
					memcpy(result_heap_ptr,
					       reinterpret_cast<data_ptr_t>(l_smaller * CastPointerToValue(l_heap_ptr) +
					                                    r_smaller * CastPointerToValue(r_heap_ptr)),
					       entry_size);
					D_ASSERT(Load<uint32_t>(result_heap_ptr) == entry_size);
					result_heap_ptr += entry_size;
					l_heap_ptr += l_smaller * entry_size;
					r_heap_ptr += r_smaller * entry_size;
					l.entry_idx += l_smaller;
					r.entry_idx += r_smaller;
				}
				// Update result indices and pointers
				result_heap_block->count += merged;
				result_heap_block->byte_offset += copy_bytes;
				copied += merged;
			} else if (r_done) {
				// Right side is exhausted - flush left
				FlushBlobs(layout, l_count, l_ptr, l.entry_idx, l_heap_ptr, *result_data_block, result_data_ptr,
				           *result_heap_block, result_heap_handle, result_heap_ptr, copied, count);
			} else {
				// Left side is exhausted - flush right
				FlushBlobs(layout, r_count, r_ptr, r.entry_idx, r_heap_ptr, *result_data_block, result_data_ptr,
				           *result_heap_block, result_heap_handle, result_heap_ptr, copied, count);
			}
			D_ASSERT(result_data_block->count == result_heap_block->count);
		}
	}
	if (reset_indices) {
		left->SetIndices(l_block_idx_before, l_entry_idx_before);
		right->SetIndices(r_block_idx_before, r_entry_idx_before);
	}
}